

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void emitblock(aec_stream *strm,int k,int ref)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  internal_state *piVar4;
  byte bVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar12;
  uint uVar13;
  byte *pbVar14;
  uint *puVar15;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  
  piVar4 = strm->state;
  pbVar14 = piVar4->cds;
  uVar13 = piVar4->bits;
  bVar5 = *pbVar14;
  if ((long)ref < (long)(ulong)strm->block_size) {
    puVar2 = piVar4->block + strm->block_size;
    uVar12 = (ulong)bVar5;
    puVar15 = piVar4->block + ref;
    do {
      uVar6 = uVar12 << 0x38;
      uVar13 = (int)uVar13 % 8 + 0x38;
      if (k < (int)uVar13) {
        do {
          iVar1 = uVar13 - k;
          uVar3 = *puVar15;
          uVar13 = uVar13 - k;
          puVar15 = puVar15 + 1;
          uVar6 = ((ulong)(uVar3 & ~(uint)(-1L << ((byte)k & 0x3f))) << ((byte)iVar1 & 0x3f)) +
                  uVar6;
          if (iVar1 <= k) break;
        } while (puVar15 < puVar2);
      }
      uVar12 = uVar6 >> 0x38;
      bVar7 = (byte)(uVar6 >> 0x38);
      bVar8 = (byte)(uVar6 >> 0x18);
      bVar9 = (byte)(uVar6 >> 0x20);
      bVar10 = (byte)(uVar6 >> 0x28);
      bVar11 = (byte)(uVar6 >> 0x30);
      bVar5 = (byte)(uVar6 >> 0x10);
      switch(uVar13 >> 3) {
      case 0:
        *pbVar14 = bVar7;
        pbVar14[1] = bVar11;
        pbVar14[2] = bVar10;
        pbVar14[3] = bVar9;
        pbVar14[4] = bVar8;
        pbVar14[5] = bVar5;
        pbVar14[6] = (byte)(uVar6 >> 8);
        pbVar14 = pbVar14 + 7;
        uVar12 = uVar6;
        break;
      case 1:
        *pbVar14 = bVar7;
        pbVar14[1] = bVar11;
        pbVar14[2] = bVar10;
        pbVar14[3] = bVar9;
        pbVar14[4] = bVar8;
        pbVar14[5] = bVar5;
        pbVar14 = pbVar14 + 6;
        uVar12 = uVar6 >> 8;
        break;
      case 2:
        *pbVar14 = bVar7;
        pbVar14[1] = bVar11;
        pbVar14[2] = bVar10;
        pbVar14[3] = bVar9;
        pbVar14[4] = bVar8;
        pbVar14 = pbVar14 + 5;
        uVar12 = uVar6 >> 0x10;
        break;
      case 3:
        *pbVar14 = bVar7;
        pbVar14[1] = bVar11;
        pbVar14[2] = bVar10;
        pbVar14[3] = bVar9;
        pbVar14 = pbVar14 + 4;
        uVar12 = uVar6 >> 0x18;
        break;
      case 4:
        *pbVar14 = bVar7;
        pbVar14[1] = bVar11;
        pbVar14[2] = bVar10;
        pbVar14 = pbVar14 + 3;
        uVar12 = uVar6 >> 0x20;
        break;
      case 5:
        *pbVar14 = bVar7;
        pbVar14[1] = bVar11;
        pbVar14 = pbVar14 + 2;
        uVar12 = uVar6 >> 0x28;
        break;
      case 6:
        *pbVar14 = bVar7;
        pbVar14 = pbVar14 + 1;
        uVar12 = uVar6 >> 0x30;
      }
      bVar5 = (byte)uVar12;
    } while (puVar15 < puVar2);
  }
  *pbVar14 = bVar5;
  piVar4->cds = pbVar14;
  piVar4->bits = (int)uVar13 % 8;
  return;
}

Assistant:

static inline void emitblock(struct aec_stream *strm, int k, int ref)
{
    /**
       Emit the k LSB of a whole block of input data.
    */

    uint64_t a;
    struct internal_state *state = strm->state;
    uint32_t *in = state->block + ref;
    uint32_t *in_end = state->block + strm->block_size;
    uint64_t mask = (UINT64_C(1) << k) - 1;
    uint8_t *o = state->cds;
    int p = state->bits;

    a = *o;

    while(in < in_end) {
        a <<= 56;
        p = (p % 8) + 56;

        while (p > k && in < in_end) {
            p -= k;
            a += ((uint64_t)(*in++) & mask) << p;
        }

        switch (p & ~7) {
        case 0:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            o[6] = (uint8_t)(a >> 8);
            o += 7;
            break;
        case 8:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            a >>= 8;
            o += 6;
            break;
        case 16:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            a >>= 16;
            o += 5;
            break;
        case 24:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            a >>= 24;
            o += 4;
            break;
        case 32:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            a >>= 32;
            o += 3;
            break;
        case 40:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            a >>= 40;
            o += 2;
            break;
        case 48:
            *o++ = (uint8_t)(a >> 56);
            a >>= 48;
            break;
        default:
            a >>= 56;
            break;
        }
    }

    *o = (uint8_t)a;
    state->cds = o;
    state->bits = p % 8;
}